

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall cmComputeLinkDepends::DisplayConstraintGraph(cmComputeLinkDepends *this)

{
  pointer pLVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  pointer pcVar5;
  ulong uVar6;
  bool bVar7;
  ostringstream e;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  pcVar5 = (this->EntryConstraintGraph).
           super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->EntryConstraintGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar5) {
    uVar4 = 0;
    uVar6 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"item ",5);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," is [",5);
      pLVar1 = (this->EntryList).
               super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,pLVar1[uVar4].Item._M_dataplus._M_p,
                          pLVar1[uVar4].Item._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]\n",2);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"  item ","");
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208," must follow it","");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"\n","");
      cmWrap<cmGraphEdgeList>(&local_228,&local_1e8,pcVar5 + uVar4,&local_208,&local_1c8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (&local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      pcVar5 = (this->EntryConstraintGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->EntryConstraintGraph).
                     super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                     super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pcVar5 >> 3) * -0x5555555555555555;
      bVar7 = uVar6 <= uVar4;
      lVar2 = uVar4 - uVar6;
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar7 && lVar2 != 0);
  }
  std::__cxx11::stringbuf::str();
  DisplayConstraintGraph();
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayConstraintGraph()
{
  // Display the graph nodes and their edges.
  std::ostringstream e;
  for (unsigned int i = 0; i < this->EntryConstraintGraph.size(); ++i) {
    EdgeList const& nl = this->EntryConstraintGraph[i];
    e << "item " << i << " is [" << this->EntryList[i].Item << "]\n";
    e << cmWrap("  item ", nl, " must follow it", "\n") << "\n";
  }
  fprintf(stderr, "%s\n", e.str().c_str());
}